

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MultiFileReader::BindOptions
          (MultiFileReader *this,MultiFileOptions *options,MultiFileList *files,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,MultiFileReaderBindData *bind_data)

{
  _Rb_tree_node_base *__k;
  FileGlobOptions *l2;
  _Rb_tree_header *p_Var1;
  string *psVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  iterator iVar5;
  _Base_ptr p_Var6;
  reference this_00;
  InternalException *pIVar7;
  BinderException *this_01;
  string *psVar8;
  MultiFileList *pMVar9;
  long lVar10;
  string *psVar11;
  long lVar12;
  MultiFileList *pMVar13;
  allocator local_319;
  MultiFileList *local_318;
  MultiFileOptions *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [2];
  vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *local_2d8;
  MultiFileReaderBindData *local_2d0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2c8;
  MultiFileListIterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  MultiFileListIterator __end2;
  MultiFileListIterationHelper local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_partitions;
  
  local_2d8 = (vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types;
  local_2d0 = bind_data;
  if (options->filename == true) {
    psVar8 = &options->filename_column;
    _Var4 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((names->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (names->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,psVar8);
    if (_Var4._M_current !=
        (names->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&__begin2,
                 "Option filename adds column \"%s\", but a column with this name is also in the file. Try setting a different name: filename=\'<filename column name>\'"
                 ,(allocator *)&__end2);
      ::std::__cxx11::string::string((string *)&local_80,(string *)psVar8);
      BinderException::BinderException<std::__cxx11::string>(this_01,(string *)&__begin2,&local_80);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_idx::optional_idx
              ((optional_idx *)&__begin2,
               (long)_Var4._M_current -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    (local_2d0->filename_idx).index = (idx_t)__begin2.file_list.ptr;
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>(local_2d8,&LogicalType::VARCHAR);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,psVar8);
  }
  if (options->hive_partitioning == true) {
    (*files->_vptr_MultiFileList[8])(&__begin2,files,0);
    HivePartitioning::Parse
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&partitions,(string *)&__begin2);
    OpenFileInfo::~OpenFileInfo((OpenFileInfo *)&__begin2);
    MultiFileListIterationHelper::MultiFileListIterationHelper
              ((MultiFileListIterationHelper *)&__begin2,files);
    local_148.file_list = __begin2.file_list.ptr;
    MultiFileListIterationHelper::begin(&__begin2,&local_148);
    local_318 = files;
    local_310 = options;
    local_2c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
    MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
              (&__end2,(MultiFileList *)0x0);
    p_Var1 = &partitions._M_t._M_impl.super__Rb_tree_header;
    while ((__begin2.file_list.ptr != __end2.file_list.ptr ||
           (__begin2.file_scan_data.current_file_idx != __end2.file_scan_data.current_file_idx))) {
      HivePartitioning::Parse
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&file_partitions._M_t,&__begin2.current_file.path);
      for (p_Var6 = partitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)
          ) {
        __k = p_Var6 + 1;
        iVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&file_partitions._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar5._M_node == &file_partitions._M_t._M_impl.super__Rb_tree_header)
        {
          ::std::__cxx11::string::string
                    ((string *)&error,
                     "Hive partition mismatch between file \"%s\" and \"%s\": key \"%s\" not found",
                     (allocator *)&local_308);
          bVar3 = local_310->auto_detect_hive_partitioning;
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          if (bVar3 != true) {
            ::std::__cxx11::string::string((string *)&local_278,error._M_dataplus._M_p,&local_319);
            (*local_318->_vptr_MultiFileList[8])(&local_308,local_318,0);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            if (local_308 == local_2f8) {
              local_1f8.field_2._8_8_ = local_2f8[0]._8_8_;
            }
            else {
              local_1f8._M_dataplus._M_p = (pointer)local_308;
            }
            local_1f8._M_string_length = local_300;
            local_300 = 0;
            local_2f8[0]._M_local_buf[0] = '\0';
            local_308 = local_2f8;
            ::std::__cxx11::string::string((string *)&local_e0,(string *)&__begin2.current_file);
            ::std::__cxx11::string::string((string *)&local_100,(string *)__k);
            BinderException::
            BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      ((BinderException *)pIVar7,&local_278,&local_1f8,&local_e0,&local_100);
            __cxa_throw(pIVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::operator+(&local_278,&error,"(hive partitioning was autodetected)");
          (*local_318->_vptr_MultiFileList[8])(&local_308,local_318,0);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          if (local_308 == local_2f8) {
            local_1d8.field_2._8_8_ = local_2f8[0]._8_8_;
          }
          else {
            local_1d8._M_dataplus._M_p = (pointer)local_308;
          }
          local_1d8._M_string_length = local_300;
          local_300 = 0;
          local_2f8[0]._M_local_buf[0] = '\0';
          local_308 = local_2f8;
          ::std::__cxx11::string::string((string *)&local_a0,(string *)&__begin2.current_file);
          ::std::__cxx11::string::string((string *)&local_c0,(string *)__k);
          InternalException::
          InternalException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (pIVar7,&local_278,&local_1d8,&local_a0,&local_c0);
          __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if (partitions._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          file_partitions._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        ::std::__cxx11::string::string
                  ((string *)&error,"Hive partition mismatch between file \"%s\" and \"%s\"",
                   (allocator *)&local_308);
        bVar3 = local_310->auto_detect_hive_partitioning;
        pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
        if (bVar3 != true) {
          ::std::__cxx11::string::string((string *)&local_278,error._M_dataplus._M_p,&local_319);
          (*local_318->_vptr_MultiFileList[8])(&local_308,local_318,0);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          if (local_308 == local_2f8) {
            local_238.field_2._8_8_ = local_2f8[0]._8_8_;
          }
          else {
            local_238._M_dataplus._M_p = (pointer)local_308;
          }
          local_238._M_string_length = local_300;
          local_300 = 0;
          local_2f8[0]._M_local_buf[0] = '\0';
          local_308 = local_2f8;
          ::std::__cxx11::string::string((string *)&local_140,(string *)&__begin2.current_file);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    ((BinderException *)pIVar7,&local_278,&local_238,&local_140);
          __cxa_throw(pIVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::operator+(&local_278,&error,"(hive partitioning was autodetected)");
        (*local_318->_vptr_MultiFileList[8])(&local_308,local_318,0);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        if (local_308 == local_2f8) {
          local_218.field_2._8_8_ = local_2f8[0]._8_8_;
        }
        else {
          local_218._M_dataplus._M_p = (pointer)local_308;
        }
        local_218._M_string_length = local_300;
        local_300 = 0;
        local_2f8[0]._M_local_buf[0] = '\0';
        local_308 = local_2f8;
        ::std::__cxx11::string::string((string *)&local_120,(string *)&__begin2.current_file);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar7,&local_278,&local_218,&local_120);
        __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&file_partitions._M_t);
      MultiFileListIterationHelper::MultiFileListIterator::Next(&__begin2);
    }
    OpenFileInfo::~OpenFileInfo(&__end2.current_file);
    OpenFileInfo::~OpenFileInfo(&__begin2.current_file);
    if ((local_310->hive_types_schema)._M_h._M_element_count != 0) {
      MultiFileOptions::VerifyHiveTypesArePartitions(local_310,&partitions);
    }
    local_2d0 = (MultiFileReaderBindData *)&local_2d0->hive_partitioning_indexes;
    while ((_Rb_tree_header *)partitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var1) {
      l2 = &((MultiFileList *)partitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
            glob_options;
      psVar8 = *(string **)local_2c8;
      psVar2 = *(string **)(local_2c8 + 8);
      lVar10 = (long)psVar2 - (long)psVar8;
      local_318 = (MultiFileList *)partitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lVar12 = lVar10 >> 7; 0 < lVar12; lVar12 = lVar12 + -1) {
        bVar3 = StringUtil::CIEquals(psVar8,(string *)l2);
        psVar11 = psVar8;
        pMVar13 = local_318;
        if (bVar3) goto LAB_008cd3de;
        bVar3 = StringUtil::CIEquals(psVar8 + 1,(string *)l2);
        psVar11 = psVar8 + 1;
        pMVar13 = local_318;
        if (bVar3) goto LAB_008cd3de;
        bVar3 = StringUtil::CIEquals(psVar8 + 2,(string *)l2);
        psVar11 = psVar8 + 2;
        pMVar13 = local_318;
        if (bVar3) goto LAB_008cd3de;
        bVar3 = StringUtil::CIEquals(psVar8 + 3,(string *)l2);
        psVar11 = psVar8 + 3;
        pMVar13 = local_318;
        if (bVar3) goto LAB_008cd3de;
        psVar8 = psVar8 + 4;
        lVar10 = lVar10 + -0x80;
      }
      lVar10 = lVar10 >> 5;
      pMVar13 = local_318;
      if (lVar10 == 1) {
LAB_008cd495:
        bVar3 = StringUtil::CIEquals(psVar8,(string *)l2);
        psVar11 = psVar2;
        if (bVar3) {
          psVar11 = psVar8;
        }
      }
      else if (lVar10 == 2) {
LAB_008cd3a5:
        pMVar13 = local_318;
        bVar3 = StringUtil::CIEquals(psVar8,(string *)l2);
        psVar11 = psVar8;
        if (!bVar3) {
          psVar8 = psVar8 + 1;
          goto LAB_008cd495;
        }
      }
      else {
        psVar11 = psVar2;
        if ((lVar10 == 3) &&
           (bVar3 = StringUtil::CIEquals(psVar8,(string *)l2), psVar11 = psVar8, pMVar13 = local_318
           , !bVar3)) {
          psVar8 = psVar8 + 1;
          goto LAB_008cd3a5;
        }
      }
LAB_008cd3de:
      pMVar9 = (MultiFileList *)((long)psVar11 - *(long *)local_2c8 >> 5);
      if (psVar11 == *(string **)(local_2c8 + 8)) {
        __end2.file_list.ptr = pMVar9;
        MultiFileOptions::GetHiveLogicalType((LogicalType *)&__begin2,local_310,(string *)l2);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2d8,
                   (LogicalType *)&__begin2);
        LogicalType::~LogicalType((LogicalType *)&__begin2);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  (local_2c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l2
                  );
      }
      else {
        pMVar9 = (MultiFileList *)NumericCastImpl<unsigned_long,_long,_false>::Convert((long)pMVar9)
        ;
        __end2.file_list.ptr = pMVar9;
        MultiFileOptions::GetHiveLogicalType((LogicalType *)&__begin2,local_310,(string *)l2);
        this_00 = vector<duckdb::LogicalType,_true>::get<true>
                            ((vector<duckdb::LogicalType,_true> *)local_2d8,(size_type)pMVar9);
        LogicalType::operator=(this_00,(LogicalType *)&__begin2);
        LogicalType::~LogicalType((LogicalType *)&__begin2);
      }
      ::std::vector<duckdb::HivePartitioningIndex,std::allocator<duckdb::HivePartitioningIndex>>::
      emplace_back<std::__cxx11::string_const&,unsigned_long&>
                ((vector<duckdb::HivePartitioningIndex,std::allocator<duckdb::HivePartitioningIndex>>
                  *)local_2d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l2,
                 (unsigned_long *)&__end2);
      partitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)pMVar13);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&partitions);
  }
  return;
}

Assistant:

void MultiFileReader::BindOptions(MultiFileOptions &options, MultiFileList &files, vector<LogicalType> &return_types,
                                  vector<string> &names, MultiFileReaderBindData &bind_data) {
	// Add generated constant column for filename
	if (options.filename) {
		if (std::find(names.begin(), names.end(), options.filename_column) != names.end()) {
			throw BinderException("Option filename adds column \"%s\", but a column with this name is also in the "
			                      "file. Try setting a different name: filename='<filename column name>'",
			                      options.filename_column);
		}
		bind_data.filename_idx = names.size();
		return_types.emplace_back(LogicalType::VARCHAR);
		names.emplace_back(options.filename_column);
	}

	// Add generated constant columns from hive partitioning scheme
	if (options.hive_partitioning) {
		D_ASSERT(files.GetExpandResult() != FileExpandResult::NO_FILES);
		auto partitions = HivePartitioning::Parse(files.GetFirstFile().path);
		// verify that all files have the same hive partitioning scheme
		for (const auto &file : files.Files()) {
			auto file_partitions = HivePartitioning::Parse(file.path);
			for (auto &part_info : partitions) {
				if (file_partitions.find(part_info.first) == file_partitions.end()) {
					string error = "Hive partition mismatch between file \"%s\" and \"%s\": key \"%s\" not found";
					if (options.auto_detect_hive_partitioning == true) {
						throw InternalException(error + "(hive partitioning was autodetected)",
						                        files.GetFirstFile().path, file.path, part_info.first);
					}
					throw BinderException(error.c_str(), files.GetFirstFile().path, file.path, part_info.first);
				}
			}
			if (partitions.size() != file_partitions.size()) {
				string error_msg = "Hive partition mismatch between file \"%s\" and \"%s\"";
				if (options.auto_detect_hive_partitioning == true) {
					throw InternalException(error_msg + "(hive partitioning was autodetected)",
					                        files.GetFirstFile().path, file.path);
				}
				throw BinderException(error_msg.c_str(), files.GetFirstFile().path, file.path);
			}
		}

		if (!options.hive_types_schema.empty()) {
			// verify that all hive_types are existing partitions
			options.VerifyHiveTypesArePartitions(partitions);
		}

		for (auto &part : partitions) {
			idx_t hive_partitioning_index;
			auto lookup = std::find_if(names.begin(), names.end(), [&](const string &col_name) {
				return StringUtil::CIEquals(col_name, part.first);
			});
			if (lookup != names.end()) {
				// hive partitioning column also exists in file - override
				auto idx = NumericCast<idx_t>(lookup - names.begin());
				hive_partitioning_index = idx;
				return_types[idx] = options.GetHiveLogicalType(part.first);
			} else {
				// hive partitioning column does not exist in file - add a new column containing the key
				hive_partitioning_index = names.size();
				return_types.emplace_back(options.GetHiveLogicalType(part.first));
				names.emplace_back(part.first);
			}
			bind_data.hive_partitioning_indexes.emplace_back(part.first, hive_partitioning_index);
		}
	}
}